

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O0

size_t test_orb_param(Mat *image_model,Mat *image_test,ORB_Param *val)

{
  bool bVar1;
  type *keypoint_test_00;
  type *m;
  _InputArray *p_Var2;
  size_type sVar3;
  undefined1 local_1c0 [8];
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> filtered_matches;
  undefined1 local_1a0 [4];
  float ratio_thresh;
  _InputArray local_188;
  undefined1 local_170 [8];
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  knn_matches;
  Ptr<cv::DescriptorMatcher> local_150 [8];
  Ptr<cv::DescriptorMatcher> matcher;
  type *descriptor_test;
  type *keypoint_test;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_120;
  type *local_a8;
  type *descriptor_model;
  type *keypoint_model;
  ORB_Param *local_20;
  ORB_Param *val_local;
  Mat *image_test_local;
  Mat *image_model_local;
  
  local_20 = val;
  val_local = (ORB_Param *)image_test;
  image_test_local = image_model;
  keypoint_compute((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                   &keypoint_model,image_model,val);
  descriptor_model =
       (type *)std::get<0ul,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>,cv::Mat>
                         ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *
                          )&keypoint_model);
  local_a8 = std::get<1ul,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>,cv::Mat>
                       ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                        &keypoint_model);
  keypoint_compute(&local_120,(Mat *)val_local,local_20);
  keypoint_test_00 =
       std::get<0ul,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>,cv::Mat>(&local_120);
  m = std::get<1ul,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>,cv::Mat>(&local_120);
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  cv::DescriptorMatcher::create((MatcherType *)local_150);
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::vector((vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
            *)local_170);
  p_Var2 = (_InputArray *)cv::Ptr<cv::DescriptorMatcher>::operator->(local_150);
  cv::_InputArray::_InputArray(&local_188,local_a8);
  cv::_InputArray::_InputArray((_InputArray *)local_1a0,m);
  bVar1 = (bool)cv::noArray();
  cv::DescriptorMatcher::knnMatch
            (p_Var2,&local_188,(vector *)local_1a0,(int)local_170,(_InputArray *)0x2,bVar1);
  cv::_InputArray::~_InputArray((_InputArray *)local_1a0);
  cv::_InputArray::~_InputArray(&local_188);
  filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3f400000;
  filter_match((vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)local_1c0,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)descriptor_model,
               keypoint_test_00,
               (vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
                *)local_170,0.75);
  sVar3 = std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::size
                    ((vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)local_1c0);
  std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::~vector
            ((vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)local_1c0);
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::~vector((vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
             *)local_170);
  cv::Ptr<cv::DescriptorMatcher>::~Ptr(local_150);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::~pair(&local_120);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::~pair
            ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
             &keypoint_model);
  return sVar3;
}

Assistant:

std::size_t test_orb_param(const cv::Mat& image_model, const cv::Mat& image_test, const ORB_Param& val)
{
    auto [keypoint_model, descriptor_model] = keypoint_compute(image_model, val);
    auto [keypoint_test, descriptor_test] = keypoint_compute(image_test, val);

#if CV_MAJOR_VERSION < 3
    auto matcher = cv::DescriptorMatcher::create("NORM_HAMMING");
#else
    auto matcher = cv::DescriptorMatcher::create(cv::DescriptorMatcher::BRUTEFORCE_HAMMING);
#endif

    std::vector<std::vector<cv::DMatch>> knn_matches;
    matcher->knnMatch(descriptor_model, descriptor_test, knn_matches, 2);

    const float ratio_thresh = 0.75f;
    std::vector<cv::DMatch> filtered_matches = filter_match(keypoint_model, keypoint_test, knn_matches, ratio_thresh);
    return filtered_matches.size();
}